

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_fkhash_nlm.hpp
# Opt level: O1

void __thiscall
poplar::compact_fkhash_nlm<int,_8UL>::release_buf_(compact_fkhash_nlm<int,_8UL> *this)

{
  pointer puVar1;
  pointer puVar2;
  uchar *__s;
  ulong __n;
  size_t __n_00;
  __array new_uptr;
  _Head_base<0UL,_unsigned_char_*,_false> local_30;
  
  puVar1 = (this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar2 = (this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  __n = (long)puVar2 - (long)puVar1;
  this->label_bytes_ = this->label_bytes_ + __n;
  __s = (uchar *)operator_new__(__n);
  memset(__s,0,__n);
  __n_00 = (long)puVar2 - (long)puVar1;
  local_30._M_head_impl = __s;
  if (__n_00 != 0) {
    memmove(__s,puVar1,__n_00);
  }
  std::
  vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
  ::emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
            ((vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
              *)this,(unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30
            );
  puVar1 = (this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (this->chunk_buf_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  if (local_30._M_head_impl != (uchar *)0x0) {
    operator_delete__(local_30._M_head_impl);
  }
  return;
}

Assistant:

void release_buf_() {
        label_bytes_ += chunk_buf_.size();
        auto new_uptr = std::make_unique<uint8_t[]>(chunk_buf_.size());
        std::copy(chunk_buf_.begin(), chunk_buf_.end(), new_uptr.get());
        chunk_ptrs_.emplace_back(std::move(new_uptr));
        chunk_buf_.clear();
    }